

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::ProgramInterfaceQueryTestCase::iterate
          (ProgramInterfaceQueryTestCase *this)

{
  ProgramInterface PVar1;
  RenderContext *renderCtx;
  TestLog *pTVar2;
  Context *pCVar3;
  PropValidator *pPVar4;
  TestLog *pTVar5;
  ShaderType type;
  int iVar6;
  Program *program_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  TestError *this_00;
  ostringstream *poVar8;
  char *__s;
  int ndx;
  long lVar9;
  ContextInfo **__x;
  Storage storage;
  long lVar10;
  bool bVar11;
  allocator<char> local_6e9;
  TestLog *local_6e8;
  Program *local_6e0;
  VariableSearchFilter variableFilter_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  targetResources;
  TransformFeedbackArraySizeValidator arraySizeValidator;
  ScopedLogSection section_4;
  ScopedLogSection section;
  BlockReferencedByShaderValidator referencedByComputeVerifier;
  BlockReferencedByShaderValidator referencedByFragmentVerifier;
  VariableSearchFilter variableFilter;
  BlockReferencedByShaderValidator referencedByGeometryVerifier;
  BlockReferencedByShaderValidator referencedByTessControlVerifier;
  BlockReferencedByShaderValidator referencedByTessEvaluationVerifier;
  ScopedLogSection section_2;
  VariableReferencedByShaderValidator referencedByGeometryVerifier_1;
  vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
  validators;
  vector<unsigned_int,_std::allocator<unsigned_int>_> props;
  VariableSearchFilter blockFilter;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  ScopedLogSection section_1;
  vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
  validators_1;
  VariableReferencedByShaderValidator referencedByComputeVerifier_2;
  VariableReferencedByShaderValidator referencedByTessEvaluationVerifier_3;
  VariableReferencedByShaderValidator referencedByTessControlVerifier_3;
  MessageBuilder builder;
  ShaderProgram program;
  
  program_00 = getAndCheckProgramDefinition(this);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])(&targetResources,this);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  local_6e0 = program_00;
  generateProgramInterfaceProgramSources((ProgramSources *)&builder,program_00);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,(ProgramSources *)&builder);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&builder);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&builder,"Program",(allocator<char> *)&referencedByFragmentVerifier);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&arraySizeValidator,"Program",(allocator<char> *)&referencedByComputeVerifier
            );
  tcu::ScopedLogSection::ScopedLogSection
            (&section,pTVar2,(string *)&builder,(string *)&arraySizeValidator);
  std::__cxx11::string::~string((string *)&arraySizeValidator);
  std::__cxx11::string::~string((string *)&builder);
  pvVar7 = ProgramInterfaceDefinition::Program::getTransformFeedbackVaryings_abi_cxx11_(local_6e0);
  if ((pvVar7->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar7->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    builder.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar8 = &builder.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar8);
    std::operator<<(&poVar8->super_basic_ostream<char,_std::char_traits<char>_>,
                    "Transform feedback varyings: {");
    lVar10 = 0;
    for (lVar9 = 0;
        pvVar7 = ProgramInterfaceDefinition::Program::getTransformFeedbackVaryings_abi_cxx11_
                           (local_6e0),
        lVar9 < (int)((ulong)((long)(pvVar7->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pvVar7->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start) >> 5);
        lVar9 = lVar9 + 1) {
      if (lVar10 != 0) {
        std::operator<<(&poVar8->super_basic_ostream<char,_std::char_traits<char>_>,", ");
      }
      std::operator<<(&poVar8->super_basic_ostream<char,_std::char_traits<char>_>,"\"");
      pvVar7 = ProgramInterfaceDefinition::Program::getTransformFeedbackVaryings_abi_cxx11_
                         (local_6e0);
      std::operator<<(&poVar8->super_basic_ostream<char,_std::char_traits<char>_>,
                      (string *)
                      ((long)&(((pvVar7->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                      lVar10));
      std::operator<<(&poVar8->super_basic_ostream<char,_std::char_traits<char>_>,"\"");
      lVar10 = lVar10 + 0x20;
    }
    std::operator<<(&poVar8->super_basic_ostream<char,_std::char_traits<char>_>,"}");
    tcu::MessageBuilder::operator<<(&builder,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar8);
  }
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,&program);
  if (program.m_program.m_info.linkOk == false) {
    builder.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar8 = &builder.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar8);
    std::operator<<(&poVar8->super_basic_ostream<char,_std::char_traits<char>_>,
                    "Program build failed, checking if program exceeded implementation limits");
    tcu::MessageBuilder::operator<<(&builder,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar8);
    iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    checkProgramResourceUsage
              (local_6e0,(Functions *)CONCAT44(extraout_var_04,iVar6),
               ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&builder,"could not build program",(allocator<char> *)&arraySizeValidator);
    tcu::TestError::TestError(this_00,(string *)&builder);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  PVar1 = (this->m_queryTarget).interface;
  switch(PVar1) {
  case PROGRAMINTERFACE_UNIFORM:
    variableFilter_1 =
         ProgramInterfaceDefinition::VariableSearchFilter::createStorageFilter(STORAGE_UNIFORM);
    pCVar3 = (this->super_TestCase).m_context;
    section.m_log = (TestLog *)&PTR_getHumanReadablePropertyString_abi_cxx11__01e5c540;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.m_testCtx =
         pCVar3->m_testCtx;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.m_renderContext
         = pCVar3->m_renderCtx;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.m_contextInfo =
         pCVar3->m_contextInfo;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.m_extension =
         (char *)0x0;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.m_validationProp
         = PROGRAMRESOURCEPROP_ARRAY_SIZE;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.
    _vptr_PropValidator = (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__01e5c640;
    referencedByFragmentVerifier.super_PropValidator.m_testCtx = pCVar3->m_testCtx;
    referencedByFragmentVerifier.super_PropValidator.m_renderContext = pCVar3->m_renderCtx;
    referencedByFragmentVerifier.super_PropValidator.m_contextInfo = pCVar3->m_contextInfo;
    referencedByFragmentVerifier.super_PropValidator.m_extension = (char *)0x0;
    referencedByFragmentVerifier.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_ARRAY_STRIDE;
    referencedByFragmentVerifier.super_PropValidator._44_4_ = variableFilter_1.m_shaderTypeBits;
    referencedByFragmentVerifier._48_4_ = variableFilter_1.m_storageBits;
    referencedByFragmentVerifier.m_shaderType = program.m_program.m_program;
    referencedByFragmentVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__01e5c720;
    referencedByComputeVerifier.super_PropValidator.m_testCtx = pCVar3->m_testCtx;
    referencedByComputeVerifier.super_PropValidator.m_renderContext = pCVar3->m_renderCtx;
    referencedByComputeVerifier.super_PropValidator.m_contextInfo = pCVar3->m_contextInfo;
    referencedByComputeVerifier.super_PropValidator.m_extension = (char *)0x0;
    referencedByComputeVerifier.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_BLOCK_INDEX;
    referencedByComputeVerifier.m_shaderType = program.m_program.m_program;
    referencedByComputeVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__01e5c768;
    referencedByGeometryVerifier.super_PropValidator.m_testCtx = pCVar3->m_testCtx;
    referencedByGeometryVerifier.super_PropValidator.m_renderContext = pCVar3->m_renderCtx;
    referencedByGeometryVerifier.super_PropValidator.m_contextInfo = pCVar3->m_contextInfo;
    referencedByGeometryVerifier.super_PropValidator.m_extension = (char *)0x0;
    referencedByGeometryVerifier.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_MATRIX_ROW_MAJOR;
    referencedByGeometryVerifier.m_shaderType = program.m_program.m_program;
    referencedByGeometryVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__01e5c7b0;
    referencedByTessControlVerifier.super_PropValidator.m_testCtx = pCVar3->m_testCtx;
    referencedByTessControlVerifier.super_PropValidator.m_renderContext = pCVar3->m_renderCtx;
    referencedByTessControlVerifier.super_PropValidator.m_contextInfo = pCVar3->m_contextInfo;
    referencedByTessControlVerifier.super_PropValidator.m_extension = (char *)0x0;
    referencedByTessControlVerifier.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_MATRIX_STRIDE;
    referencedByTessControlVerifier.m_shaderType = program.m_program.m_program;
    referencedByTessControlVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__01e5c7f8;
    referencedByTessEvaluationVerifier.super_PropValidator.m_testCtx = pCVar3->m_testCtx;
    referencedByTessEvaluationVerifier.super_PropValidator.m_renderContext = pCVar3->m_renderCtx;
    referencedByTessEvaluationVerifier.super_PropValidator.m_contextInfo = pCVar3->m_contextInfo;
    referencedByTessEvaluationVerifier.super_PropValidator.m_extension = (char *)0x0;
    referencedByTessEvaluationVerifier.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_ATOMIC_COUNTER_BUFFER_INDEX;
    referencedByTessEvaluationVerifier.m_shaderType = program.m_program.m_program;
    referencedByTessEvaluationVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__01e5c840;
    referencedByGeometryVerifier_1.super_PropValidator.m_testCtx = pCVar3->m_testCtx;
    referencedByGeometryVerifier_1.super_PropValidator.m_renderContext = pCVar3->m_renderCtx;
    referencedByGeometryVerifier_1.super_PropValidator.m_contextInfo = pCVar3->m_contextInfo;
    referencedByGeometryVerifier_1.super_PropValidator.m_extension = (char *)0x0;
    referencedByGeometryVerifier_1.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_LOCATION;
    referencedByGeometryVerifier_1.m_shaderType = program.m_program.m_program;
    referencedByGeometryVerifier_1.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__01e5c888;
    props.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)pCVar3->m_testCtx;
    props.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)pCVar3->m_renderCtx;
    props.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)&PTR_getHumanReadablePropertyString_abi_cxx11__01e5c8d0;
    validators.
    super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)pCVar3->m_testCtx;
    validators.
    super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pCVar3->m_renderCtx;
    validators.
    super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&PTR_getHumanReadablePropertyString_abi_cxx11__01e5c918;
    unique0x10002517 = variableFilter_1;
    referencedByComputeVerifier._44_8_ = variableFilter_1;
    referencedByGeometryVerifier._44_8_ = variableFilter_1;
    referencedByTessControlVerifier._44_8_ = variableFilter_1;
    referencedByTessEvaluationVerifier._44_8_ = variableFilter_1;
    referencedByGeometryVerifier_1._44_8_ = variableFilter_1;
    Functional::anon_unknown_0::VariableReferencedByShaderValidator::
    VariableReferencedByShaderValidator
              (&referencedByComputeVerifier_2,(this->super_TestCase).m_context,SHADERTYPE_VERTEX,
               &variableFilter_1);
    Functional::anon_unknown_0::VariableReferencedByShaderValidator::
    VariableReferencedByShaderValidator
              ((VariableReferencedByShaderValidator *)&blockFilter,(this->super_TestCase).m_context,
               SHADERTYPE_FRAGMENT,&variableFilter_1);
    Functional::anon_unknown_0::VariableReferencedByShaderValidator::
    VariableReferencedByShaderValidator
              ((VariableReferencedByShaderValidator *)&section_1,(this->super_TestCase).m_context,
               SHADERTYPE_COMPUTE,&variableFilter_1);
    Functional::anon_unknown_0::VariableReferencedByShaderValidator::
    VariableReferencedByShaderValidator
              ((VariableReferencedByShaderValidator *)&validators_1,(this->super_TestCase).m_context
               ,SHADERTYPE_GEOMETRY,&variableFilter_1);
    Functional::anon_unknown_0::VariableReferencedByShaderValidator::
    VariableReferencedByShaderValidator
              (&referencedByTessControlVerifier_3,(this->super_TestCase).m_context,
               SHADERTYPE_TESSELLATION_CONTROL,&variableFilter_1);
    Functional::anon_unknown_0::VariableReferencedByShaderValidator::
    VariableReferencedByShaderValidator
              (&referencedByTessEvaluationVerifier_3,(this->super_TestCase).m_context,
               SHADERTYPE_TESSELLATION_EVALUATION,&variableFilter_1);
    builder.m_log = (TestLog *)CONCAT44(builder.m_log._4_4_,0x92fb);
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)&arraySizeValidator;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._8_4_ = 0x92fe;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._24_4_ = 0x9301;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._32_8_ =
         &referencedByTessEvaluationVerifier;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._40_4_ = 0x92fd;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._48_8_ =
         &referencedByComputeVerifier;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._56_4_ = 0x9300;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._64_8_ =
         &referencedByGeometryVerifier;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._72_4_ = 0x930e;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._80_8_ =
         &referencedByGeometryVerifier_1;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._88_4_ = 0x92ff;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._96_8_ =
         &referencedByTessControlVerifier;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._104_4_ = 0x92f9;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._112_8_ = &props;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._120_4_ = 0x92fc;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._128_8_ = &validators;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._136_4_ = 0x9306;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._144_8_ =
         &referencedByComputeVerifier_2;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._152_4_ = 0x930a;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._160_8_ = &blockFilter;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._168_4_ = 0x930b;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._176_8_ = &section_1;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._184_4_ = 0x9309;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._200_4_ = 0x9307;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._216_4_ = 0x9308;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._232_4_ = 0x92fa;
    lVar9 = 0;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ =
         &referencedByFragmentVerifier;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._192_8_ =
         (VariableReferencedByShaderValidator *)&validators_1;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._208_8_ =
         &referencedByTessControlVerifier_3;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._224_8_ =
         &referencedByTessEvaluationVerifier_3;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._240_8_ =
         (ContextInfo *)&section;
    while( true ) {
      if ((int)((ulong)((long)targetResources.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)targetResources.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 5) <= lVar9) break;
      pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&variableFilter,"UniformResource",&local_6e9);
      std::operator+(&local_3c8,"Uniform resource \"",
                     targetResources.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar9);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section_2
                     ,&local_3c8,"\"");
      tcu::ScopedLogSection::ScopedLogSection
                (&section_4,pTVar2,(string *)&variableFilter,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section_2);
      local_6e8 = (TestLog *)lVar9;
      std::__cxx11::string::~string((string *)&section_2);
      std::__cxx11::string::~string((string *)&local_3c8);
      std::__cxx11::string::~string((string *)&variableFilter);
      iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
      variableFilter.m_shaderTypeBits = 0;
      variableFilter.m_storageBits = 0;
      section_2.m_log = (TestLog *)0x0;
      poVar8 = &builder.m_str;
      lVar10 = 0x10;
      while (bVar11 = lVar10 != 0, lVar10 = lVar10 + -1, bVar11) {
        pPVar4 = (PropValidator *)
                 (poVar8->super_basic_ostream<char,_std::char_traits<char>_>)._vptr_basic_ostream;
        if ((((this->m_queryTarget).propFlags & pPVar4->m_validationProp) != 0) &&
           (bVar11 = Functional::anon_unknown_0::PropValidator::isSupported(pPVar4), bVar11)) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&variableFilter,
                     (value_type_conflict4 *)((long)(poVar8 + -1) + 0x170));
          std::
          vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
          ::push_back((vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                       *)&section_2,(value_type *)poVar8);
        }
        poVar8 = (ostringstream *)
                 &(poVar8->super_basic_ostream<char,_std::char_traits<char>_>).field_0x10;
      }
      queryAndValidateProps
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 (Functions *)CONCAT44(extraout_var_02,iVar6),program.m_program.m_program,
                 (this->m_queryTarget).interface,
                 targetResources.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar9]._M_dataplus._M_p,local_6e0,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&variableFilter,
                 (vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                  *)&section_2);
      std::
      vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
      ::~vector((vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                 *)&section_2);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&variableFilter);
      tcu::ScopedLogSection::~ScopedLogSection(&section_4);
      lVar9 = (long)local_6e8 + 1;
    }
    break;
  case PROGRAMINTERFACE_UNIFORM_BLOCK:
  case PROGRAMINTERFACE_SHADER_STORAGE_BLOCK:
    register0x00000000 =
         ProgramInterfaceDefinition::VariableSearchFilter::createStorageFilter
                   ((PVar1 != PROGRAMINTERFACE_UNIFORM_BLOCK) + STORAGE_UNIFORM);
    pCVar3 = (this->super_TestCase).m_context;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.m_testCtx =
         pCVar3->m_testCtx;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.m_renderContext
         = pCVar3->m_renderCtx;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.m_contextInfo =
         pCVar3->m_contextInfo;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.m_extension =
         (char *)0x0;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.m_validationProp
         = PROGRAMRESOURCEPROP_NAME_LENGTH;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.
    _vptr_PropValidator = (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__01e5c998;
    blockFilter = register0x00000000;
    Functional::anon_unknown_0::BlockReferencedByShaderValidator::BlockReferencedByShaderValidator
              ((BlockReferencedByShaderValidator *)&section,pCVar3,SHADERTYPE_VERTEX,&blockFilter);
    Functional::anon_unknown_0::BlockReferencedByShaderValidator::BlockReferencedByShaderValidator
              (&referencedByFragmentVerifier,(this->super_TestCase).m_context,SHADERTYPE_FRAGMENT,
               &blockFilter);
    Functional::anon_unknown_0::BlockReferencedByShaderValidator::BlockReferencedByShaderValidator
              (&referencedByComputeVerifier,(this->super_TestCase).m_context,SHADERTYPE_COMPUTE,
               &blockFilter);
    Functional::anon_unknown_0::BlockReferencedByShaderValidator::BlockReferencedByShaderValidator
              (&referencedByGeometryVerifier,(this->super_TestCase).m_context,SHADERTYPE_GEOMETRY,
               &blockFilter);
    Functional::anon_unknown_0::BlockReferencedByShaderValidator::BlockReferencedByShaderValidator
              (&referencedByTessControlVerifier,(this->super_TestCase).m_context,
               SHADERTYPE_TESSELLATION_CONTROL,&blockFilter);
    Functional::anon_unknown_0::BlockReferencedByShaderValidator::BlockReferencedByShaderValidator
              (&referencedByTessEvaluationVerifier,(this->super_TestCase).m_context,
               SHADERTYPE_TESSELLATION_EVALUATION,&blockFilter);
    pCVar3 = (this->super_TestCase).m_context;
    referencedByGeometryVerifier_1.super_PropValidator.m_testCtx = pCVar3->m_testCtx;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._112_8_ =
         &referencedByGeometryVerifier_1;
    referencedByGeometryVerifier_1.super_PropValidator.m_renderContext = pCVar3->m_renderCtx;
    referencedByGeometryVerifier_1.super_PropValidator.m_contextInfo = pCVar3->m_contextInfo;
    referencedByGeometryVerifier_1.super_PropValidator.m_extension = (char *)0x0;
    referencedByGeometryVerifier_1.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_BUFFER_BINDING;
    referencedByGeometryVerifier_1.super_PropValidator._44_4_ = blockFilter.m_shaderTypeBits;
    referencedByGeometryVerifier_1._48_4_ = blockFilter.m_storageBits;
    referencedByGeometryVerifier_1.m_shaderType = program.m_program.m_program;
    referencedByGeometryVerifier_1.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__01e5ca28;
    builder.m_log = (TestLog *)CONCAT44(builder.m_log._4_4_,0x92f9);
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)&arraySizeValidator;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._8_4_ = 0x9306;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._24_4_ = 0x930a;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._32_8_ =
         &referencedByFragmentVerifier;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._40_4_ = 0x930b;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._56_4_ = 0x9309;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._72_4_ = 0x9307;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._88_4_ = 0x9308;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._104_4_ = 0x9302;
    lVar9 = 0;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ =
         (BlockReferencedByShaderValidator *)&section;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._48_8_ =
         &referencedByComputeVerifier;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._64_8_ =
         &referencedByGeometryVerifier;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._80_8_ =
         &referencedByTessControlVerifier;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._96_8_ =
         &referencedByTessEvaluationVerifier;
    while (lVar9 < (int)((ulong)((long)targetResources.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)targetResources.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 5)) {
      local_6e8 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&props,"BlockResource",(allocator<char> *)&validators_1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &referencedByComputeVerifier_2,"Interface block \"",
                     targetResources.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar9);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &validators,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &referencedByComputeVerifier_2,"\"");
      tcu::ScopedLogSection::ScopedLogSection
                (&section_1,local_6e8,(string *)&props,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&validators);
      local_6e8 = (TestLog *)lVar9;
      std::__cxx11::string::~string((string *)&validators);
      std::__cxx11::string::~string((string *)&referencedByComputeVerifier_2);
      std::__cxx11::string::~string((string *)&props);
      iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
      props.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      validators.
      super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      props.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      props.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      validators.
      super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      validators.
      super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      poVar8 = &builder.m_str;
      lVar10 = 8;
      while (bVar11 = lVar10 != 0, lVar10 = lVar10 + -1, bVar11) {
        pPVar4 = (PropValidator *)
                 (poVar8->super_basic_ostream<char,_std::char_traits<char>_>)._vptr_basic_ostream;
        if ((((this->m_queryTarget).propFlags & pPVar4->m_validationProp) != 0) &&
           (bVar11 = Functional::anon_unknown_0::PropValidator::isSupported(pPVar4), bVar11)) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (&props,(value_type_conflict4 *)((long)(poVar8 + -1) + 0x170));
          std::
          vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
          ::push_back(&validators,(value_type *)poVar8);
        }
        poVar8 = (ostringstream *)
                 &(poVar8->super_basic_ostream<char,_std::char_traits<char>_>).field_0x10;
      }
      queryAndValidateProps
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 (Functions *)CONCAT44(extraout_var,iVar6),program.m_program.m_program,
                 (this->m_queryTarget).interface,
                 targetResources.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar9]._M_dataplus._M_p,local_6e0,&props,
                 &validators);
      std::
      vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
      ::~vector(&validators);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&props);
      tcu::ScopedLogSection::~ScopedLogSection(&section_1);
      lVar9 = (long)local_6e8 + 1;
    }
    break;
  case PROGRAMINTERFACE_PROGRAM_INPUT:
  case PROGRAMINTERFACE_PROGRAM_OUTPUT:
    if (PVar1 == PROGRAMINTERFACE_PROGRAM_INPUT) {
      type = ProgramInterfaceDefinition::Program::getFirstStage(local_6e0);
      if (type != SHADERTYPE_GEOMETRY) {
        if (type == SHADERTYPE_TESSELLATION_EVALUATION) {
          getMaxPatchVertices(this);
          type = SHADERTYPE_TESSELLATION_EVALUATION;
        }
        else if (type == SHADERTYPE_TESSELLATION_CONTROL) {
          getMaxPatchVertices(this);
          goto LAB_01307de2;
        }
      }
    }
    else {
      type = ProgramInterfaceDefinition::Program::getLastStage(local_6e0);
      if (type == SHADERTYPE_TESSELLATION_CONTROL) {
        ProgramInterfaceDefinition::Program::getTessellationNumOutputPatchVertices(local_6e0);
LAB_01307de2:
        type = SHADERTYPE_TESSELLATION_CONTROL;
      }
    }
    builder.m_log =
         (TestLog *)ProgramInterfaceDefinition::VariableSearchFilter::createShaderTypeFilter(type);
    storage = (Storage)(PVar1 != PROGRAMINTERFACE_PROGRAM_INPUT);
    section.m_log =
         (TestLog *)ProgramInterfaceDefinition::VariableSearchFilter::createStorageFilter(storage);
    referencedByFragmentVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)
         ProgramInterfaceDefinition::VariableSearchFilter::createStorageFilter
                   (storage + STORAGE_PATCH_IN);
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.
    _vptr_PropValidator =
         (_func_int **)
         ProgramInterfaceDefinition::VariableSearchFilter::logicalOr
                   ((VariableSearchFilter *)&section,
                    (VariableSearchFilter *)&referencedByFragmentVerifier);
    register0x00000000 =
         ProgramInterfaceDefinition::VariableSearchFilter::logicalAnd
                   ((VariableSearchFilter *)&builder,(VariableSearchFilter *)&arraySizeValidator);
    pCVar3 = (this->super_TestCase).m_context;
    section.m_log = (TestLog *)&PTR_getHumanReadablePropertyString_abi_cxx11__01e5c540;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.m_testCtx =
         pCVar3->m_testCtx;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.m_renderContext
         = pCVar3->m_renderCtx;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.m_contextInfo =
         pCVar3->m_contextInfo;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.m_extension =
         (char *)0x0;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.m_validationProp
         = PROGRAMRESOURCEPROP_ARRAY_SIZE;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.
    _vptr_PropValidator = (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__01e5c640;
    referencedByFragmentVerifier.super_PropValidator.m_testCtx = pCVar3->m_testCtx;
    referencedByFragmentVerifier.super_PropValidator.m_renderContext = pCVar3->m_renderCtx;
    referencedByFragmentVerifier.super_PropValidator.m_contextInfo = pCVar3->m_contextInfo;
    referencedByFragmentVerifier.super_PropValidator.m_extension = (char *)0x0;
    referencedByFragmentVerifier.super_PropValidator.m_validationProp = PROGRAMRESOURCEPROP_LOCATION
    ;
    referencedByFragmentVerifier.super_PropValidator._44_4_ =
         arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator._44_4_;
    referencedByFragmentVerifier._48_4_ = arraySizeValidator._48_4_;
    referencedByFragmentVerifier.m_shaderType = program.m_program.m_program;
    referencedByFragmentVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__01e5c888;
    referencedByComputeVerifier.super_PropValidator.m_testCtx = pCVar3->m_testCtx;
    referencedByComputeVerifier.super_PropValidator.m_renderContext = pCVar3->m_renderCtx;
    referencedByComputeVerifier.super_PropValidator.m_contextInfo = pCVar3->m_contextInfo;
    referencedByComputeVerifier.super_PropValidator.m_extension = (char *)0x0;
    referencedByComputeVerifier.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_NAME_LENGTH;
    referencedByComputeVerifier.m_shaderType = program.m_program.m_program;
    referencedByComputeVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__01e5c8d0;
    referencedByComputeVerifier._44_8_ = register0x00000000;
    variableFilter = register0x00000000;
    Functional::anon_unknown_0::VariableReferencedByShaderValidator::
    VariableReferencedByShaderValidator
              ((VariableReferencedByShaderValidator *)&referencedByGeometryVerifier,pCVar3,
               SHADERTYPE_VERTEX,&variableFilter);
    Functional::anon_unknown_0::VariableReferencedByShaderValidator::
    VariableReferencedByShaderValidator
              ((VariableReferencedByShaderValidator *)&referencedByTessControlVerifier,
               (this->super_TestCase).m_context,SHADERTYPE_FRAGMENT,&variableFilter);
    Functional::anon_unknown_0::VariableReferencedByShaderValidator::
    VariableReferencedByShaderValidator
              ((VariableReferencedByShaderValidator *)&referencedByTessEvaluationVerifier,
               (this->super_TestCase).m_context,SHADERTYPE_COMPUTE,&variableFilter);
    Functional::anon_unknown_0::VariableReferencedByShaderValidator::
    VariableReferencedByShaderValidator
              (&referencedByGeometryVerifier_1,(this->super_TestCase).m_context,SHADERTYPE_GEOMETRY,
               &variableFilter);
    Functional::anon_unknown_0::VariableReferencedByShaderValidator::
    VariableReferencedByShaderValidator
              ((VariableReferencedByShaderValidator *)&props,(this->super_TestCase).m_context,
               SHADERTYPE_TESSELLATION_CONTROL,&variableFilter);
    Functional::anon_unknown_0::VariableReferencedByShaderValidator::
    VariableReferencedByShaderValidator
              ((VariableReferencedByShaderValidator *)&validators,(this->super_TestCase).m_context,
               SHADERTYPE_TESSELLATION_EVALUATION,&variableFilter);
    pCVar3 = (this->super_TestCase).m_context;
    referencedByComputeVerifier_2.super_PropValidator.m_testCtx = pCVar3->m_testCtx;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._160_8_ =
         &referencedByComputeVerifier_2;
    referencedByComputeVerifier_2.super_PropValidator.m_renderContext = pCVar3->m_renderCtx;
    referencedByComputeVerifier_2.super_PropValidator.m_contextInfo = pCVar3->m_contextInfo;
    referencedByComputeVerifier_2.super_PropValidator.m_extension = "GL_EXT_tessellation_shader";
    referencedByComputeVerifier_2.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_IS_PER_PATCH;
    referencedByComputeVerifier_2.super_PropValidator._44_4_ = variableFilter.m_shaderTypeBits;
    referencedByComputeVerifier_2._48_4_ = variableFilter.m_storageBits;
    referencedByComputeVerifier_2.m_shaderType = program.m_program.m_program;
    referencedByComputeVerifier_2.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__01e5ca68;
    builder.m_log = (TestLog *)CONCAT44(builder.m_log._4_4_,0x92fb);
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)&arraySizeValidator;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._8_4_ = 0x930e;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._24_4_ = 0x92f9;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._32_8_ =
         &referencedByComputeVerifier;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._40_4_ = 0x9306;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._48_8_ =
         &referencedByGeometryVerifier;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._56_4_ = 0x930a;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._64_8_ =
         &referencedByTessControlVerifier;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._72_4_ = 0x930b;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._88_4_ = 0x9309;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._104_4_ = 0x9307;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._120_4_ = 0x9308;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._136_4_ = 0x92fa;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._144_8_ = &section;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._152_4_ = 0x92e7;
    lVar9 = 0;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ =
         &referencedByFragmentVerifier;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._80_8_ =
         (VariableReferencedByShaderValidator *)&referencedByTessEvaluationVerifier;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._96_8_ =
         &referencedByGeometryVerifier_1;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._112_8_ =
         (VariableReferencedByShaderValidator *)&props;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._128_8_ =
         (VariableReferencedByShaderValidator *)&validators;
    while( true ) {
      if ((int)((ulong)((long)targetResources.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)targetResources.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 5) <= lVar9) break;
      __s = "Output";
      if ((this->m_queryTarget).interface == PROGRAMINTERFACE_PROGRAM_INPUT) {
        __s = "Input";
      }
      local_6e8 = (TestLog *)lVar9;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&blockFilter,__s,(allocator<char> *)&section_1);
      pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&section_1,"BlockResource",(allocator<char> *)&local_3c8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &referencedByTessEvaluationVerifier_3,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &blockFilter," resource \"");
      pTVar5 = local_6e8;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &referencedByTessControlVerifier_3,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &referencedByTessEvaluationVerifier_3,
                     targetResources.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + (long)local_6e8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &validators_1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &referencedByTessControlVerifier_3,"\"");
      tcu::ScopedLogSection::ScopedLogSection
                (&section_2,pTVar2,(string *)&section_1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&validators_1)
      ;
      std::__cxx11::string::~string((string *)&validators_1);
      std::__cxx11::string::~string((string *)&referencedByTessControlVerifier_3);
      std::__cxx11::string::~string((string *)&referencedByTessEvaluationVerifier_3);
      std::__cxx11::string::~string((string *)&section_1);
      iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
      validators_1.
      super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      section_1.m_log = (TestLog *)0x0;
      validators_1.
      super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      validators_1.
      super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      poVar8 = &builder.m_str;
      lVar9 = 0xb;
      while (bVar11 = lVar9 != 0, lVar9 = lVar9 + -1, bVar11) {
        pPVar4 = (PropValidator *)
                 (poVar8->super_basic_ostream<char,_std::char_traits<char>_>)._vptr_basic_ostream;
        if ((((this->m_queryTarget).propFlags & pPVar4->m_validationProp) != 0) &&
           (bVar11 = Functional::anon_unknown_0::PropValidator::isSupported(pPVar4), bVar11)) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&section_1,
                     (value_type_conflict4 *)((long)(poVar8 + -1) + 0x170));
          std::
          vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
          ::push_back(&validators_1,(value_type *)poVar8);
        }
        poVar8 = (ostringstream *)
                 &(poVar8->super_basic_ostream<char,_std::char_traits<char>_>).field_0x10;
      }
      queryAndValidateProps
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 (Functions *)CONCAT44(extraout_var_03,iVar6),program.m_program.m_program,
                 (this->m_queryTarget).interface,
                 targetResources.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[(long)pTVar5]._M_dataplus._M_p,local_6e0,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&section_1,&validators_1);
      std::
      vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
      ::~vector(&validators_1);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&section_1);
      tcu::ScopedLogSection::~ScopedLogSection(&section_2);
      std::__cxx11::string::~string((string *)&blockFilter);
      lVar9 = (long)local_6e8 + 1;
    }
    break;
  case PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING:
    pCVar3 = (this->super_TestCase).m_context;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)pCVar3->m_testCtx;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = pCVar3->m_renderCtx;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = pCVar3->m_contextInfo;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = 0;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._32_4_ = 0x800;
    builder.m_log = (TestLog *)&PTR_getHumanReadablePropertyString_abi_cxx11__01e5cb90;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.m_testCtx =
         pCVar3->m_testCtx;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.m_renderContext
         = pCVar3->m_renderCtx;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.m_contextInfo =
         pCVar3->m_contextInfo;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.m_extension =
         (char *)0x0;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.m_validationProp
         = PROGRAMRESOURCEPROP_ARRAY_SIZE;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.
    _vptr_PropValidator = (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__01e5cbf0;
    section.m_log = (TestLog *)&PTR_getHumanReadablePropertyString_abi_cxx11__01e5cc38;
    referencedByFragmentVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)
         CONCAT44(referencedByFragmentVerifier.super_PropValidator._vptr_PropValidator._4_4_,0x92fb)
    ;
    referencedByFragmentVerifier.super_PropValidator.m_testCtx = (TestContext *)&arraySizeValidator;
    referencedByFragmentVerifier.super_PropValidator.m_renderContext =
         (RenderContext *)
         CONCAT44(referencedByFragmentVerifier.super_PropValidator.m_renderContext._4_4_,0x92f9);
    referencedByFragmentVerifier.super_PropValidator.m_extension =
         (char *)CONCAT44(referencedByFragmentVerifier.super_PropValidator.m_extension._4_4_,0x92fa)
    ;
    referencedByFragmentVerifier.super_PropValidator._40_8_ = &builder;
    lVar9 = 0;
    referencedByFragmentVerifier.super_PropValidator.m_contextInfo = (ContextInfo *)&section;
    while (lVar9 < (int)((ulong)((long)targetResources.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)targetResources.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 5)) {
      local_6e8 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&referencedByComputeVerifier,"XFBVariableResource",
                 (allocator<char> *)&referencedByGeometryVerifier_1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &referencedByTessControlVerifier,"Transform feedback varying \"",
                     targetResources.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar9);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &referencedByGeometryVerifier,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &referencedByTessControlVerifier,"\"");
      tcu::ScopedLogSection::ScopedLogSection
                ((ScopedLogSection *)&referencedByTessEvaluationVerifier,local_6e8,
                 (string *)&referencedByComputeVerifier,(string *)&referencedByGeometryVerifier);
      local_6e8 = (TestLog *)lVar9;
      std::__cxx11::string::~string((string *)&referencedByGeometryVerifier);
      std::__cxx11::string::~string((string *)&referencedByTessControlVerifier);
      std::__cxx11::string::~string((string *)&referencedByComputeVerifier);
      iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
      referencedByComputeVerifier.super_PropValidator.m_renderContext = (RenderContext *)0x0;
      referencedByGeometryVerifier.super_PropValidator.m_renderContext = (RenderContext *)0x0;
      referencedByComputeVerifier.super_PropValidator._vptr_PropValidator = (_func_int **)0x0;
      referencedByComputeVerifier.super_PropValidator.m_testCtx = (TestContext *)0x0;
      referencedByGeometryVerifier.super_PropValidator._vptr_PropValidator = (_func_int **)0x0;
      referencedByGeometryVerifier.super_PropValidator.m_testCtx = (TestContext *)0x0;
      __x = (ContextInfo **)&referencedByFragmentVerifier.super_PropValidator.m_testCtx;
      lVar10 = 3;
      while (bVar11 = lVar10 != 0, lVar10 = lVar10 + -1, bVar11) {
        if (((this->m_queryTarget).propFlags &
            *(ProgramResourcePropFlags *)&(*__x)->m_compressedTextureFormats) != 0) {
          bVar11 = Functional::anon_unknown_0::PropValidator::isSupported((PropValidator *)*__x);
          if (bVar11) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       &referencedByComputeVerifier,(value_type_conflict4 *)(__x + -1));
            std::
            vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
            ::push_back((vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                         *)&referencedByGeometryVerifier,(value_type *)__x);
          }
        }
        __x = __x + 2;
      }
      queryAndValidateProps
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 (Functions *)CONCAT44(extraout_var_00,iVar6),program.m_program.m_program,
                 (this->m_queryTarget).interface,
                 targetResources.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar9]._M_dataplus._M_p,local_6e0,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&referencedByComputeVerifier
                 ,(vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                   *)&referencedByGeometryVerifier);
      std::
      vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
      ::~vector((vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                 *)&referencedByGeometryVerifier);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &referencedByComputeVerifier);
      tcu::ScopedLogSection::~ScopedLogSection
                ((ScopedLogSection *)&referencedByTessEvaluationVerifier);
      lVar9 = (long)local_6e8 + 1;
    }
    break;
  case PROGRAMINTERFACE_BUFFER_VARIABLE:
    variableFilter_1 =
         ProgramInterfaceDefinition::VariableSearchFilter::createStorageFilter(STORAGE_BUFFER);
    pCVar3 = (this->super_TestCase).m_context;
    section.m_log = (TestLog *)&PTR_getHumanReadablePropertyString_abi_cxx11__01e5c540;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.m_testCtx =
         pCVar3->m_testCtx;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.m_renderContext
         = pCVar3->m_renderCtx;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.m_contextInfo =
         pCVar3->m_contextInfo;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.m_extension =
         (char *)0x0;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.m_validationProp
         = PROGRAMRESOURCEPROP_ARRAY_SIZE;
    arraySizeValidator.super_TransformFeedbackResourceValidator.super_PropValidator.
    _vptr_PropValidator = (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__01e5c640;
    referencedByFragmentVerifier.super_PropValidator.m_testCtx = pCVar3->m_testCtx;
    referencedByFragmentVerifier.super_PropValidator.m_renderContext = pCVar3->m_renderCtx;
    referencedByFragmentVerifier.super_PropValidator.m_contextInfo = pCVar3->m_contextInfo;
    referencedByFragmentVerifier.super_PropValidator.m_extension = (char *)0x0;
    referencedByFragmentVerifier.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_ARRAY_STRIDE;
    referencedByFragmentVerifier.super_PropValidator._44_4_ = variableFilter_1.m_shaderTypeBits;
    referencedByFragmentVerifier._48_4_ = variableFilter_1.m_storageBits;
    referencedByFragmentVerifier.m_shaderType = program.m_program.m_program;
    referencedByFragmentVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__01e5c720;
    referencedByComputeVerifier.super_PropValidator.m_testCtx = pCVar3->m_testCtx;
    referencedByComputeVerifier.super_PropValidator.m_renderContext = pCVar3->m_renderCtx;
    referencedByComputeVerifier.super_PropValidator.m_contextInfo = pCVar3->m_contextInfo;
    referencedByComputeVerifier.super_PropValidator.m_extension = (char *)0x0;
    referencedByComputeVerifier.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_BLOCK_INDEX;
    referencedByComputeVerifier.m_shaderType = program.m_program.m_program;
    referencedByComputeVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__01e5c768;
    referencedByGeometryVerifier.super_PropValidator.m_testCtx = pCVar3->m_testCtx;
    referencedByGeometryVerifier.super_PropValidator.m_renderContext = pCVar3->m_renderCtx;
    referencedByGeometryVerifier.super_PropValidator.m_contextInfo = pCVar3->m_contextInfo;
    referencedByGeometryVerifier.super_PropValidator.m_extension = (char *)0x0;
    referencedByGeometryVerifier.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_MATRIX_ROW_MAJOR;
    referencedByGeometryVerifier.m_shaderType = program.m_program.m_program;
    referencedByGeometryVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__01e5c7b0;
    referencedByTessControlVerifier.super_PropValidator.m_testCtx = pCVar3->m_testCtx;
    referencedByTessControlVerifier.super_PropValidator.m_renderContext = pCVar3->m_renderCtx;
    referencedByTessControlVerifier.super_PropValidator.m_contextInfo = pCVar3->m_contextInfo;
    referencedByTessControlVerifier.super_PropValidator.m_extension = (char *)0x0;
    referencedByTessControlVerifier.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_MATRIX_STRIDE;
    referencedByTessControlVerifier.m_shaderType = program.m_program.m_program;
    referencedByTessControlVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__01e5c7f8;
    referencedByTessEvaluationVerifier.super_PropValidator.m_testCtx = pCVar3->m_testCtx;
    referencedByTessEvaluationVerifier.super_PropValidator.m_renderContext = pCVar3->m_renderCtx;
    referencedByTessEvaluationVerifier.super_PropValidator.m_contextInfo = pCVar3->m_contextInfo;
    referencedByTessEvaluationVerifier.super_PropValidator.m_extension = (char *)0x0;
    referencedByTessEvaluationVerifier.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_OFFSET;
    referencedByTessEvaluationVerifier.m_shaderType = program.m_program.m_program;
    referencedByTessEvaluationVerifier.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__01e5c918;
    referencedByGeometryVerifier_1.super_PropValidator.m_testCtx = pCVar3->m_testCtx;
    referencedByGeometryVerifier_1.super_PropValidator.m_renderContext = pCVar3->m_renderCtx;
    referencedByGeometryVerifier_1.super_PropValidator.m_contextInfo = pCVar3->m_contextInfo;
    referencedByGeometryVerifier_1.super_PropValidator.m_extension = (char *)0x0;
    referencedByGeometryVerifier_1.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_NAME_LENGTH;
    referencedByGeometryVerifier_1.m_shaderType = program.m_program.m_program;
    referencedByGeometryVerifier_1.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__01e5c8d0;
    unique0x1000250f = variableFilter_1;
    referencedByComputeVerifier._44_8_ = variableFilter_1;
    referencedByGeometryVerifier._44_8_ = variableFilter_1;
    referencedByTessControlVerifier._44_8_ = variableFilter_1;
    referencedByTessEvaluationVerifier._44_8_ = variableFilter_1;
    referencedByGeometryVerifier_1._44_8_ = variableFilter_1;
    Functional::anon_unknown_0::VariableReferencedByShaderValidator::
    VariableReferencedByShaderValidator
              ((VariableReferencedByShaderValidator *)&props,pCVar3,SHADERTYPE_VERTEX,
               &variableFilter_1);
    Functional::anon_unknown_0::VariableReferencedByShaderValidator::
    VariableReferencedByShaderValidator
              ((VariableReferencedByShaderValidator *)&validators,(this->super_TestCase).m_context,
               SHADERTYPE_FRAGMENT,&variableFilter_1);
    Functional::anon_unknown_0::VariableReferencedByShaderValidator::
    VariableReferencedByShaderValidator
              (&referencedByComputeVerifier_2,(this->super_TestCase).m_context,SHADERTYPE_COMPUTE,
               &variableFilter_1);
    Functional::anon_unknown_0::VariableReferencedByShaderValidator::
    VariableReferencedByShaderValidator
              ((VariableReferencedByShaderValidator *)&blockFilter,(this->super_TestCase).m_context,
               SHADERTYPE_GEOMETRY,&variableFilter_1);
    Functional::anon_unknown_0::VariableReferencedByShaderValidator::
    VariableReferencedByShaderValidator
              ((VariableReferencedByShaderValidator *)&section_1,(this->super_TestCase).m_context,
               SHADERTYPE_TESSELLATION_CONTROL,&variableFilter_1);
    Functional::anon_unknown_0::VariableReferencedByShaderValidator::
    VariableReferencedByShaderValidator
              ((VariableReferencedByShaderValidator *)&validators_1,(this->super_TestCase).m_context
               ,SHADERTYPE_TESSELLATION_EVALUATION,&variableFilter_1);
    pCVar3 = (this->super_TestCase).m_context;
    referencedByTessControlVerifier_3.super_PropValidator.m_testCtx = pCVar3->m_testCtx;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._208_8_ =
         &referencedByTessControlVerifier_3;
    referencedByTessControlVerifier_3.super_PropValidator.m_renderContext = pCVar3->m_renderCtx;
    referencedByTessControlVerifier_3.super_PropValidator.m_contextInfo = pCVar3->m_contextInfo;
    referencedByTessControlVerifier_3.super_PropValidator.m_extension = (char *)0x0;
    referencedByTessControlVerifier_3.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_TOP_LEVEL_ARRAY_SIZE;
    referencedByTessControlVerifier_3.super_PropValidator._44_4_ = variableFilter_1.m_shaderTypeBits
    ;
    referencedByTessControlVerifier_3._48_4_ = variableFilter_1.m_storageBits;
    referencedByTessControlVerifier_3.m_shaderType = program.m_program.m_program;
    referencedByTessControlVerifier_3.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__01e5cb00;
    referencedByTessEvaluationVerifier_3.super_PropValidator.m_testCtx = pCVar3->m_testCtx;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._224_8_ =
         &referencedByTessEvaluationVerifier_3;
    referencedByTessEvaluationVerifier_3.super_PropValidator.m_renderContext = pCVar3->m_renderCtx;
    referencedByTessEvaluationVerifier_3.super_PropValidator.m_contextInfo = pCVar3->m_contextInfo;
    referencedByTessEvaluationVerifier_3.super_PropValidator.m_extension = (char *)0x0;
    referencedByTessEvaluationVerifier_3.super_PropValidator.m_validationProp =
         PROGRAMRESOURCEPROP_TOP_LEVEL_ARRAY_STRIDE;
    referencedByTessEvaluationVerifier_3.super_PropValidator._44_4_ =
         variableFilter_1.m_shaderTypeBits;
    referencedByTessEvaluationVerifier_3._48_4_ = variableFilter_1.m_storageBits;
    referencedByTessEvaluationVerifier_3.m_shaderType = program.m_program.m_program;
    referencedByTessEvaluationVerifier_3.super_PropValidator._vptr_PropValidator =
         (_func_int **)&PTR_getHumanReadablePropertyString_abi_cxx11__01e5cb48;
    builder.m_log = (TestLog *)CONCAT44(builder.m_log._4_4_,0x92fb);
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)&arraySizeValidator;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._8_4_ = 0x92fe;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._24_4_ = 0x92fd;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._32_8_ =
         &referencedByComputeVerifier;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._40_4_ = 0x9300;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._48_8_ =
         &referencedByGeometryVerifier;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._56_4_ = 0x92ff;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._64_8_ =
         &referencedByTessControlVerifier;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._72_4_ = 0x92f9;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._80_8_ =
         &referencedByGeometryVerifier_1;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._88_4_ = 0x92fc;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._96_8_ =
         &referencedByTessEvaluationVerifier;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._104_4_ = 0x9306;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._112_8_ = &props;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._120_4_ = 0x930a;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._128_8_ = &validators;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._136_4_ = 0x930b;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._144_8_ =
         &referencedByComputeVerifier_2;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._152_4_ = 0x9309;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._168_4_ = 0x9307;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._184_4_ = 0x9308;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._200_4_ = 0x930c;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._216_4_ = 0x930d;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._232_4_ = 0x92fa;
    lVar9 = 0;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ =
         &referencedByFragmentVerifier;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._160_8_ =
         (VariableReferencedByShaderValidator *)&blockFilter;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._176_8_ =
         (VariableReferencedByShaderValidator *)&section_1;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._192_8_ =
         (VariableReferencedByShaderValidator *)&validators_1;
    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._240_8_ =
         (ContextInfo *)&section;
    while( true ) {
      if ((int)((ulong)((long)targetResources.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)targetResources.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 5) <= lVar9) break;
      pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&variableFilter,"BufferVariableResource",&local_6e9);
      std::operator+(&local_3c8,"Buffer variable \"",
                     targetResources.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar9);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section_2
                     ,&local_3c8,"\"");
      tcu::ScopedLogSection::ScopedLogSection
                (&section_4,pTVar2,(string *)&variableFilter,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section_2);
      local_6e8 = (TestLog *)lVar9;
      std::__cxx11::string::~string((string *)&section_2);
      std::__cxx11::string::~string((string *)&local_3c8);
      std::__cxx11::string::~string((string *)&variableFilter);
      iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
      variableFilter.m_shaderTypeBits = 0;
      variableFilter.m_storageBits = 0;
      section_2.m_log = (TestLog *)0x0;
      poVar8 = &builder.m_str;
      lVar10 = 0x10;
      while (bVar11 = lVar10 != 0, lVar10 = lVar10 + -1, bVar11) {
        pPVar4 = (PropValidator *)
                 (poVar8->super_basic_ostream<char,_std::char_traits<char>_>)._vptr_basic_ostream;
        if ((((this->m_queryTarget).propFlags & pPVar4->m_validationProp) != 0) &&
           (bVar11 = Functional::anon_unknown_0::PropValidator::isSupported(pPVar4), bVar11)) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&variableFilter,
                     (value_type_conflict4 *)((long)(poVar8 + -1) + 0x170));
          std::
          vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
          ::push_back((vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                       *)&section_2,(value_type *)poVar8);
        }
        poVar8 = (ostringstream *)
                 &(poVar8->super_basic_ostream<char,_std::char_traits<char>_>).field_0x10;
      }
      queryAndValidateProps
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 (Functions *)CONCAT44(extraout_var_01,iVar6),program.m_program.m_program,
                 (this->m_queryTarget).interface,
                 targetResources.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar9]._M_dataplus._M_p,local_6e0,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&variableFilter,
                 (vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                  *)&section_2);
      std::
      vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
      ::~vector((vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                 *)&section_2);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&variableFilter);
      tcu::ScopedLogSection::~ScopedLogSection(&section_4);
      lVar9 = (long)local_6e8 + 1;
    }
  }
  glu::ShaderProgram::~ShaderProgram(&program);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&targetResources);
  return STOP;
}

Assistant:

ProgramInterfaceQueryTestCase::IterateResult ProgramInterfaceQueryTestCase::iterate (void)
{
	struct TestProperty
	{
		glw::GLenum				prop;
		const PropValidator*	validator;
	};

	const ProgramInterfaceDefinition::Program*	programDefinition	= getAndCheckProgramDefinition();
	const std::vector<std::string>				targetResources		= getQueryTargetResources();
	glu::ShaderProgram							program				(m_context.getRenderContext(), generateProgramInterfaceProgramSources(programDefinition));

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	// Log program
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Program", "Program");

		// Feedback varyings
		if (!programDefinition->getTransformFeedbackVaryings().empty())
		{
			tcu::MessageBuilder builder(&m_testCtx.getLog());
			builder << "Transform feedback varyings: {";
			for (int ndx = 0; ndx < (int)programDefinition->getTransformFeedbackVaryings().size(); ++ndx)
			{
				if (ndx)
					builder << ", ";
				builder << "\"" << programDefinition->getTransformFeedbackVaryings()[ndx] << "\"";
			}
			builder << "}" << tcu::TestLog::EndMessage;
		}

		m_testCtx.getLog() << program;
		if (!program.isOk())
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Program build failed, checking if program exceeded implementation limits" << tcu::TestLog::EndMessage;
			checkProgramResourceUsage(programDefinition, m_context.getRenderContext().getFunctions(), m_testCtx.getLog());

			// within limits
			throw tcu::TestError("could not build program");
		}
	}

	// Check interface props

	switch (m_queryTarget.interface)
	{
		case PROGRAMINTERFACE_UNIFORM:
		{
			const VariableSearchFilter					uniformFilter						= VariableSearchFilter::createStorageFilter(glu::STORAGE_UNIFORM);

			const TypeValidator							typeValidator						(m_context, program.getProgram(),						uniformFilter);
			const ArraySizeValidator					arraySizeValidator					(m_context, program.getProgram(),						-1,					uniformFilter);
			const ArrayStrideValidator					arrayStrideValidator				(m_context, program.getProgram(),						uniformFilter);
			const BlockIndexValidator					blockIndexValidator					(m_context, program.getProgram(),						uniformFilter);
			const IsRowMajorValidator					isRowMajorValidator					(m_context, program.getProgram(),						uniformFilter);
			const MatrixStrideValidator					matrixStrideValidator				(m_context, program.getProgram(),						uniformFilter);
			const AtomicCounterBufferIndexVerifier		atomicCounterBufferIndexVerifier	(m_context, program.getProgram(),						uniformFilter);
			const LocationValidator						locationValidator					(m_context, program.getProgram(),						uniformFilter);
			const VariableNameLengthValidator			nameLengthValidator					(m_context, program.getProgram(),						uniformFilter);
			const OffsetValidator						offsetVerifier						(m_context, program.getProgram(),						uniformFilter);
			const VariableReferencedByShaderValidator	referencedByVertexVerifier			(m_context, glu::SHADERTYPE_VERTEX,						uniformFilter);
			const VariableReferencedByShaderValidator	referencedByFragmentVerifier		(m_context, glu::SHADERTYPE_FRAGMENT,					uniformFilter);
			const VariableReferencedByShaderValidator	referencedByComputeVerifier			(m_context, glu::SHADERTYPE_COMPUTE,					uniformFilter);
			const VariableReferencedByShaderValidator	referencedByGeometryVerifier		(m_context, glu::SHADERTYPE_GEOMETRY,					uniformFilter);
			const VariableReferencedByShaderValidator	referencedByTessControlVerifier		(m_context, glu::SHADERTYPE_TESSELLATION_CONTROL,		uniformFilter);
			const VariableReferencedByShaderValidator	referencedByTessEvaluationVerifier	(m_context, glu::SHADERTYPE_TESSELLATION_EVALUATION,	uniformFilter);

			const TestProperty allProperties[] =
			{
				{ GL_ARRAY_SIZE,							&arraySizeValidator					},
				{ GL_ARRAY_STRIDE,							&arrayStrideValidator				},
				{ GL_ATOMIC_COUNTER_BUFFER_INDEX,			&atomicCounterBufferIndexVerifier	},
				{ GL_BLOCK_INDEX,							&blockIndexValidator				},
				{ GL_IS_ROW_MAJOR,							&isRowMajorValidator				},
				{ GL_LOCATION,								&locationValidator					},
				{ GL_MATRIX_STRIDE,							&matrixStrideValidator				},
				{ GL_NAME_LENGTH,							&nameLengthValidator				},
				{ GL_OFFSET,								&offsetVerifier						},
				{ GL_REFERENCED_BY_VERTEX_SHADER,			&referencedByVertexVerifier			},
				{ GL_REFERENCED_BY_FRAGMENT_SHADER,			&referencedByFragmentVerifier		},
				{ GL_REFERENCED_BY_COMPUTE_SHADER,			&referencedByComputeVerifier		},
				{ GL_REFERENCED_BY_GEOMETRY_SHADER,			&referencedByGeometryVerifier		},
				{ GL_REFERENCED_BY_TESS_CONTROL_SHADER,		&referencedByTessControlVerifier	},
				{ GL_REFERENCED_BY_TESS_EVALUATION_SHADER,	&referencedByTessEvaluationVerifier	},
				{ GL_TYPE,									&typeValidator						},
			};

			for (int targetResourceNdx = 0; targetResourceNdx < (int)targetResources.size(); ++targetResourceNdx)
			{
				const tcu::ScopedLogSection			section			(m_testCtx.getLog(), "UniformResource", "Uniform resource \"" +  targetResources[targetResourceNdx] + "\"");
				const glw::Functions&				gl				= m_context.getRenderContext().getFunctions();
				std::vector<glw::GLenum>			props;
				std::vector<const PropValidator*>	validators;

				for (int propNdx = 0; propNdx < DE_LENGTH_OF_ARRAY(allProperties); ++propNdx)
				{
					if (allProperties[propNdx].validator->isSelected(m_queryTarget.propFlags) &&
						allProperties[propNdx].validator->isSupported())
					{
						props.push_back(allProperties[propNdx].prop);
						validators.push_back(allProperties[propNdx].validator);
					}
				}

				DE_ASSERT(!props.empty());

				queryAndValidateProps(m_testCtx, gl, program.getProgram(), m_queryTarget.interface, targetResources[targetResourceNdx].c_str(), programDefinition, props, validators);
			}

			break;
		}

		case PROGRAMINTERFACE_UNIFORM_BLOCK:
		case PROGRAMINTERFACE_SHADER_STORAGE_BLOCK:
		{
			const glu::Storage						storage								= (m_queryTarget.interface == PROGRAMINTERFACE_UNIFORM_BLOCK) ? (glu::STORAGE_UNIFORM) : (glu::STORAGE_BUFFER);
			const VariableSearchFilter				blockFilter							= VariableSearchFilter::createStorageFilter(storage);

			const BlockNameLengthValidator			nameLengthValidator					(m_context, program.getProgram(),						blockFilter);
			const BlockReferencedByShaderValidator	referencedByVertexVerifier			(m_context, glu::SHADERTYPE_VERTEX,						blockFilter);
			const BlockReferencedByShaderValidator	referencedByFragmentVerifier		(m_context, glu::SHADERTYPE_FRAGMENT,					blockFilter);
			const BlockReferencedByShaderValidator	referencedByComputeVerifier			(m_context, glu::SHADERTYPE_COMPUTE,					blockFilter);
			const BlockReferencedByShaderValidator	referencedByGeometryVerifier		(m_context, glu::SHADERTYPE_GEOMETRY,					blockFilter);
			const BlockReferencedByShaderValidator	referencedByTessControlVerifier		(m_context, glu::SHADERTYPE_TESSELLATION_CONTROL,		blockFilter);
			const BlockReferencedByShaderValidator	referencedByTessEvaluationVerifier	(m_context, glu::SHADERTYPE_TESSELLATION_EVALUATION,	blockFilter);
			const BufferBindingValidator			bufferBindingValidator				(m_context, program.getProgram(),						blockFilter);

			const TestProperty allProperties[] =
			{
				{ GL_NAME_LENGTH,							&nameLengthValidator				},
				{ GL_REFERENCED_BY_VERTEX_SHADER,			&referencedByVertexVerifier			},
				{ GL_REFERENCED_BY_FRAGMENT_SHADER,			&referencedByFragmentVerifier		},
				{ GL_REFERENCED_BY_COMPUTE_SHADER,			&referencedByComputeVerifier		},
				{ GL_REFERENCED_BY_GEOMETRY_SHADER,			&referencedByGeometryVerifier		},
				{ GL_REFERENCED_BY_TESS_CONTROL_SHADER,		&referencedByTessControlVerifier	},
				{ GL_REFERENCED_BY_TESS_EVALUATION_SHADER,	&referencedByTessEvaluationVerifier	},
				{ GL_BUFFER_BINDING,						&bufferBindingValidator				},
			};

			for (int targetResourceNdx = 0; targetResourceNdx < (int)targetResources.size(); ++targetResourceNdx)
			{
				const tcu::ScopedLogSection			section			(m_testCtx.getLog(), "BlockResource", "Interface block \"" +  targetResources[targetResourceNdx] + "\"");
				const glw::Functions&				gl				= m_context.getRenderContext().getFunctions();
				std::vector<glw::GLenum>			props;
				std::vector<const PropValidator*>	validators;

				for (int propNdx = 0; propNdx < DE_LENGTH_OF_ARRAY(allProperties); ++propNdx)
				{
					if (allProperties[propNdx].validator->isSelected(m_queryTarget.propFlags) &&
						allProperties[propNdx].validator->isSupported())
					{
						props.push_back(allProperties[propNdx].prop);
						validators.push_back(allProperties[propNdx].validator);
					}
				}

				DE_ASSERT(!props.empty());

				queryAndValidateProps(m_testCtx, gl, program.getProgram(), m_queryTarget.interface, targetResources[targetResourceNdx].c_str(), programDefinition, props, validators);
			}

			break;
		}

		case PROGRAMINTERFACE_PROGRAM_INPUT:
		case PROGRAMINTERFACE_PROGRAM_OUTPUT:
		{
			const bool									isInputCase							= (m_queryTarget.interface == PROGRAMINTERFACE_PROGRAM_INPUT);
			const glu::Storage							varyingStorage						= (isInputCase) ? (glu::STORAGE_IN) : (glu::STORAGE_OUT);
			const glu::Storage							patchStorage						= (isInputCase) ? (glu::STORAGE_PATCH_IN) : (glu::STORAGE_PATCH_OUT);
			const glu::ShaderType						shaderType							= (isInputCase) ? (programDefinition->getFirstStage()) : (programDefinition->getLastStage());
			const int									unsizedArraySize					= (isInputCase && shaderType == glu::SHADERTYPE_GEOMETRY)					? (1)															// input points
																							: (isInputCase && shaderType == glu::SHADERTYPE_TESSELLATION_CONTROL)		? (getMaxPatchVertices())										// input batch size
																							: (!isInputCase && shaderType == glu::SHADERTYPE_TESSELLATION_CONTROL)		? (programDefinition->getTessellationNumOutputPatchVertices())	// output batch size
																							: (isInputCase && shaderType == glu::SHADERTYPE_TESSELLATION_EVALUATION)	? (getMaxPatchVertices())										// input batch size
																							: (-1);
			const VariableSearchFilter					variableFilter						= VariableSearchFilter::logicalAnd(VariableSearchFilter::createShaderTypeFilter(shaderType),
																															   VariableSearchFilter::logicalOr(VariableSearchFilter::createStorageFilter(varyingStorage),
																																							   VariableSearchFilter::createStorageFilter(patchStorage)));

			const TypeValidator							typeValidator						(m_context, program.getProgram(),						variableFilter);
			const ArraySizeValidator					arraySizeValidator					(m_context, program.getProgram(),						unsizedArraySize,		variableFilter);
			const LocationValidator						locationValidator					(m_context, program.getProgram(),						variableFilter);
			const VariableNameLengthValidator			nameLengthValidator					(m_context, program.getProgram(),						variableFilter);
			const VariableReferencedByShaderValidator	referencedByVertexVerifier			(m_context, glu::SHADERTYPE_VERTEX,						variableFilter);
			const VariableReferencedByShaderValidator	referencedByFragmentVerifier		(m_context, glu::SHADERTYPE_FRAGMENT,					variableFilter);
			const VariableReferencedByShaderValidator	referencedByComputeVerifier			(m_context, glu::SHADERTYPE_COMPUTE,					variableFilter);
			const VariableReferencedByShaderValidator	referencedByGeometryVerifier		(m_context, glu::SHADERTYPE_GEOMETRY,					variableFilter);
			const VariableReferencedByShaderValidator	referencedByTessControlVerifier		(m_context, glu::SHADERTYPE_TESSELLATION_CONTROL,		variableFilter);
			const VariableReferencedByShaderValidator	referencedByTessEvaluationVerifier	(m_context, glu::SHADERTYPE_TESSELLATION_EVALUATION,	variableFilter);
			const PerPatchValidator						perPatchValidator					(m_context, program.getProgram(),						variableFilter);

			const TestProperty allProperties[] =
			{
				{ GL_ARRAY_SIZE,							&arraySizeValidator					},
				{ GL_LOCATION,								&locationValidator					},
				{ GL_NAME_LENGTH,							&nameLengthValidator				},
				{ GL_REFERENCED_BY_VERTEX_SHADER,			&referencedByVertexVerifier			},
				{ GL_REFERENCED_BY_FRAGMENT_SHADER,			&referencedByFragmentVerifier		},
				{ GL_REFERENCED_BY_COMPUTE_SHADER,			&referencedByComputeVerifier		},
				{ GL_REFERENCED_BY_GEOMETRY_SHADER,			&referencedByGeometryVerifier		},
				{ GL_REFERENCED_BY_TESS_CONTROL_SHADER,		&referencedByTessControlVerifier	},
				{ GL_REFERENCED_BY_TESS_EVALUATION_SHADER,	&referencedByTessEvaluationVerifier	},
				{ GL_TYPE,									&typeValidator						},
				{ GL_IS_PER_PATCH,							&perPatchValidator					},
			};

			for (int targetResourceNdx = 0; targetResourceNdx < (int)targetResources.size(); ++targetResourceNdx)
			{
				const std::string					resourceInterfaceName	= (m_queryTarget.interface == PROGRAMINTERFACE_PROGRAM_INPUT) ? ("Input") : ("Output");
				const tcu::ScopedLogSection			section					(m_testCtx.getLog(), "BlockResource", resourceInterfaceName + " resource \"" +  targetResources[targetResourceNdx] + "\"");
				const glw::Functions&				gl						= m_context.getRenderContext().getFunctions();
				std::vector<glw::GLenum>			props;
				std::vector<const PropValidator*>	validators;

				for (int propNdx = 0; propNdx < DE_LENGTH_OF_ARRAY(allProperties); ++propNdx)
				{
					if (allProperties[propNdx].validator->isSelected(m_queryTarget.propFlags) &&
						allProperties[propNdx].validator->isSupported())
					{
						props.push_back(allProperties[propNdx].prop);
						validators.push_back(allProperties[propNdx].validator);
					}
				}

				DE_ASSERT(!props.empty());

				queryAndValidateProps(m_testCtx, gl, program.getProgram(), m_queryTarget.interface, targetResources[targetResourceNdx].c_str(), programDefinition, props, validators);
			}

			break;
		}

		case PROGRAMINTERFACE_BUFFER_VARIABLE:
		{
			const VariableSearchFilter					variableFilter						= VariableSearchFilter::createStorageFilter(glu::STORAGE_BUFFER);

			const TypeValidator							typeValidator						(m_context, program.getProgram(),						variableFilter);
			const ArraySizeValidator					arraySizeValidator					(m_context, program.getProgram(),						0,					variableFilter);
			const ArrayStrideValidator					arrayStrideValidator				(m_context, program.getProgram(),						variableFilter);
			const BlockIndexValidator					blockIndexValidator					(m_context, program.getProgram(),						variableFilter);
			const IsRowMajorValidator					isRowMajorValidator					(m_context, program.getProgram(),						variableFilter);
			const MatrixStrideValidator					matrixStrideValidator				(m_context, program.getProgram(),						variableFilter);
			const OffsetValidator						offsetValidator						(m_context, program.getProgram(),						variableFilter);
			const VariableNameLengthValidator			nameLengthValidator					(m_context, program.getProgram(),						variableFilter);
			const VariableReferencedByShaderValidator	referencedByVertexVerifier			(m_context, glu::SHADERTYPE_VERTEX,						variableFilter);
			const VariableReferencedByShaderValidator	referencedByFragmentVerifier		(m_context, glu::SHADERTYPE_FRAGMENT,					variableFilter);
			const VariableReferencedByShaderValidator	referencedByComputeVerifier			(m_context, glu::SHADERTYPE_COMPUTE,					variableFilter);
			const VariableReferencedByShaderValidator	referencedByGeometryVerifier		(m_context, glu::SHADERTYPE_GEOMETRY,					variableFilter);
			const VariableReferencedByShaderValidator	referencedByTessControlVerifier		(m_context, glu::SHADERTYPE_TESSELLATION_CONTROL,		variableFilter);
			const VariableReferencedByShaderValidator	referencedByTessEvaluationVerifier	(m_context, glu::SHADERTYPE_TESSELLATION_EVALUATION,	variableFilter);
			const TopLevelArraySizeValidator			topLevelArraySizeValidator			(m_context, program.getProgram(),						variableFilter);
			const TopLevelArrayStrideValidator			topLevelArrayStrideValidator		(m_context, program.getProgram(),						variableFilter);

			const TestProperty allProperties[] =
			{
				{ GL_ARRAY_SIZE,							&arraySizeValidator					},
				{ GL_ARRAY_STRIDE,							&arrayStrideValidator				},
				{ GL_BLOCK_INDEX,							&blockIndexValidator				},
				{ GL_IS_ROW_MAJOR,							&isRowMajorValidator				},
				{ GL_MATRIX_STRIDE,							&matrixStrideValidator				},
				{ GL_NAME_LENGTH,							&nameLengthValidator				},
				{ GL_OFFSET,								&offsetValidator					},
				{ GL_REFERENCED_BY_VERTEX_SHADER,			&referencedByVertexVerifier			},
				{ GL_REFERENCED_BY_FRAGMENT_SHADER,			&referencedByFragmentVerifier		},
				{ GL_REFERENCED_BY_COMPUTE_SHADER,			&referencedByComputeVerifier		},
				{ GL_REFERENCED_BY_GEOMETRY_SHADER,			&referencedByGeometryVerifier		},
				{ GL_REFERENCED_BY_TESS_CONTROL_SHADER,		&referencedByTessControlVerifier	},
				{ GL_REFERENCED_BY_TESS_EVALUATION_SHADER,	&referencedByTessEvaluationVerifier	},
				{ GL_TOP_LEVEL_ARRAY_SIZE,					&topLevelArraySizeValidator			},
				{ GL_TOP_LEVEL_ARRAY_STRIDE,				&topLevelArrayStrideValidator		},
				{ GL_TYPE,									&typeValidator						},
			};

			for (int targetResourceNdx = 0; targetResourceNdx < (int)targetResources.size(); ++targetResourceNdx)
			{
				const tcu::ScopedLogSection			section			(m_testCtx.getLog(), "BufferVariableResource", "Buffer variable \"" +  targetResources[targetResourceNdx] + "\"");
				const glw::Functions&				gl				= m_context.getRenderContext().getFunctions();
				std::vector<glw::GLenum>			props;
				std::vector<const PropValidator*>	validators;

				for (int propNdx = 0; propNdx < DE_LENGTH_OF_ARRAY(allProperties); ++propNdx)
				{
					if (allProperties[propNdx].validator->isSelected(m_queryTarget.propFlags) &&
						allProperties[propNdx].validator->isSupported())
					{
						props.push_back(allProperties[propNdx].prop);
						validators.push_back(allProperties[propNdx].validator);
					}
				}

				DE_ASSERT(!props.empty());

				queryAndValidateProps(m_testCtx, gl, program.getProgram(), m_queryTarget.interface, targetResources[targetResourceNdx].c_str(), programDefinition, props, validators);
			}

			break;
		}

		case PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING:
		{
			const TransformFeedbackTypeValidator		typeValidator			(m_context);
			const TransformFeedbackArraySizeValidator	arraySizeValidator		(m_context);
			const TransformFeedbackNameLengthValidator	nameLengthValidator		(m_context);

			const TestProperty allProperties[] =
			{
				{ GL_ARRAY_SIZE,					&arraySizeValidator				},
				{ GL_NAME_LENGTH,					&nameLengthValidator			},
				{ GL_TYPE,							&typeValidator					},
			};

			for (int targetResourceNdx = 0; targetResourceNdx < (int)targetResources.size(); ++targetResourceNdx)
			{
				const tcu::ScopedLogSection			section			(m_testCtx.getLog(), "XFBVariableResource", "Transform feedback varying \"" +  targetResources[targetResourceNdx] + "\"");
				const glw::Functions&				gl				= m_context.getRenderContext().getFunctions();
				std::vector<glw::GLenum>			props;
				std::vector<const PropValidator*>	validators;

				for (int propNdx = 0; propNdx < DE_LENGTH_OF_ARRAY(allProperties); ++propNdx)
				{
					if (allProperties[propNdx].validator->isSelected(m_queryTarget.propFlags) &&
						allProperties[propNdx].validator->isSupported())
					{
						props.push_back(allProperties[propNdx].prop);
						validators.push_back(allProperties[propNdx].validator);
					}
				}

				DE_ASSERT(!props.empty());

				queryAndValidateProps(m_testCtx, gl, program.getProgram(), m_queryTarget.interface, targetResources[targetResourceNdx].c_str(), programDefinition, props, validators);
			}

			break;
		}

		default:
			DE_ASSERT(false);
	}

	return STOP;
}